

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::Bloaty::ScanAndRollupFiles
          (Bloaty *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *build_ids,Rollup *rollup)

{
  ChildMap *pCVar1;
  string *pattern;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  __uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> this_00;
  Rollup *this_01;
  uint uVar9;
  _Head_base<0UL,_bloaty::ReImpl_*,_false> this_02;
  long lVar10;
  pointer __p;
  size_type __n;
  pointer other;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pPVar14;
  bool bVar15;
  unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> regex;
  string error;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  ThreadSafeIterIndex index;
  __uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> local_118;
  Bloaty *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  string local_100;
  thread local_e0;
  vector<PerThreadData,_std::allocator<PerThreadData>_> local_d8;
  ulong local_b8;
  Rollup *local_b0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a8;
  vector<std::thread,_std::allocator<std::thread>_> local_a0;
  ThreadSafeIterIndex local_88;
  
  local_110 = this;
  local_b0 = rollup;
  local_a8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)build_ids;
  uVar9 = std::thread::hardware_concurrency();
  uVar12 = (ulong)((long)(filenames->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(filenames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar13 = uVar12 & 0xffffffff;
  if ((int)uVar9 < (int)uVar12) {
    uVar13 = (ulong)uVar9;
  }
  iVar11 = (int)uVar13;
  local_108 = filenames;
  if (iVar11 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  __n = (size_type)iVar11;
  if (iVar11 == 0) {
    local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(__n * 0x78);
    local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
         super__Vector_impl_data._M_start + __n;
    lVar10 = -__n;
    local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
         super__Vector_impl_data._M_start;
    do {
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).filter_regex_ = (ReImpl *)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_buckets = (__buckets_ptr)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_bucket_count = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_element_count = 0;
      *(undefined8 *)
       &((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
          super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_rehash_policy = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).filtered_vm_total_ = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).filtered_file_total_ = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).vm_total_ = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).file_total_ = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_buckets =
           &((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
              super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_single_bucket;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_bucket_count = 1;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_element_count = 0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_rehash_policy.
      _M_max_load_factor = 1.0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_rehash_policy._M_next_resize =
           0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->rollup).children_._M_h._M_single_bucket =
           (__node_base_ptr)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->build_ids).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->build_ids).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
        super__Vector_impl_data._M_finish)->build_ids).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
  }
  other = local_d8.super__Vector_base<PerThreadData,_std::allocator<PerThreadData>_>._M_impl.
          super__Vector_impl_data._M_start;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_a0,__n,(allocator_type *)&local_88);
  local_88.error_._M_dataplus._M_p = (pointer)&local_88.error_.field_2;
  local_88.index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_88.error_._M_string_length = 0;
  local_88.error_.field_2._M_local_buf[0] = '\0';
  local_88.mutex_.super___mutex_base._M_mutex.__align = 0;
  local_88.mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  local_88.mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  local_88.mutex_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.mutex_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_88.max_ =
       (int)((ulong)((long)(local_108->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_108->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_118._M_t.super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
  super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl =
       (tuple<bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>)
       (_Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>)0x0;
  if (((local_110->options_)._has_bits_.has_bits_[0] & 2) != 0) {
    pattern = (local_110->options_).source_filter_.ptr_;
    this_02._M_head_impl = (ReImpl *)operator_new(0xd8);
    re2::RE2::RE2((RE2 *)this_02._M_head_impl,pattern);
    this_00._M_t.super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
    super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl =
         local_118._M_t.
         super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
         super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl;
    local_100._M_dataplus._M_p = (pointer)0x0;
    bVar15 = local_118._M_t.
             super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
             super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl !=
             (_Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>)0x0;
    local_118._M_t.super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
    super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl =
         (tuple<bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>)
         (tuple<bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>)this_02._M_head_impl;
    if (bVar15) {
      re2::RE2::~RE2((RE2 *)this_00._M_t.
                            super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>
                            .super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl);
      operator_delete((void *)this_00._M_t.
                              super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>
                              .super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl,0xd8);
    }
    std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
              ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)&local_100);
  }
  if (iVar11 != 0) {
    uVar12 = 0;
    pPVar14 = other;
    local_b8 = uVar13;
    do {
      (pPVar14->rollup).filter_regex_ =
           (ReImpl *)
           local_118._M_t.
           super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
           super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl;
      local_e0._M_id._M_thread = (id)0;
      local_100._M_dataplus._M_p = (pointer)operator_new(0x28);
      *(undefined ***)local_100._M_dataplus._M_p = &PTR___State_00620198;
      *(pointer *)((long)local_100._M_dataplus._M_p + 8) = pPVar14;
      *(Bloaty **)((long)local_100._M_dataplus._M_p + 0x10) = local_110;
      *(ThreadSafeIterIndex **)((long)local_100._M_dataplus._M_p + 0x18) = &local_88;
      *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)((long)local_100._M_dataplus._M_p + 0x20) = local_108;
      std::thread::_M_start_thread(&local_e0,&local_100,0);
      if ((long *)local_100._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_100._M_dataplus._M_p + 8))();
      }
      this_01 = local_b0;
      if (local_a0.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12]._M_id._M_thread != 0) {
        std::terminate();
      }
      local_a0.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12]._M_id._M_thread =
           (native_handle_type)local_e0._M_id._M_thread;
      uVar12 = uVar12 + 1;
      pPVar14 = pPVar14 + 1;
    } while (uVar13 != uVar12);
    if ((int)local_b8 != 0) {
      pCVar1 = &local_b0->children_;
      lVar10 = 0;
      do {
        std::thread::join();
        if (lVar10 == 0) {
          this_01->filter_regex_ = (other->rollup).filter_regex_;
          iVar6 = (other->rollup).vm_total_;
          uVar2 = *(undefined4 *)((long)&(other->rollup).vm_total_ + 4);
          iVar7 = (other->rollup).file_total_;
          uVar3 = *(undefined4 *)((long)&(other->rollup).file_total_ + 4);
          uVar4 = *(undefined4 *)((long)&(other->rollup).filtered_vm_total_ + 4);
          iVar8 = (other->rollup).filtered_file_total_;
          uVar5 = *(undefined4 *)((long)&(other->rollup).filtered_file_total_ + 4);
          *(int *)&this_01->filtered_vm_total_ = (int)(other->rollup).filtered_vm_total_;
          *(undefined4 *)((long)&this_01->filtered_vm_total_ + 4) = uVar4;
          *(int *)&this_01->filtered_file_total_ = (int)iVar8;
          *(undefined4 *)((long)&this_01->filtered_file_total_ + 4) = uVar5;
          *(int *)&this_01->vm_total_ = (int)iVar6;
          *(undefined4 *)((long)&this_01->vm_total_ + 4) = uVar2;
          *(int *)&this_01->file_total_ = (int)iVar7;
          *(undefined4 *)((long)&this_01->file_total_ + 4) = uVar3;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign(&pCVar1->_M_h,&(other->rollup).children_);
        }
        else {
          Rollup::Add(this_01,&other->rollup);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_a8,*(undefined8 *)(local_a8 + 8),
                   (other->build_ids).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (other->build_ids).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        lVar10 = lVar10 + 8;
        other = other + 1;
      } while (uVar13 << 3 != lVar10);
    }
  }
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  bVar15 = ThreadSafeIterIndex::TryGetError(&local_88,&local_100);
  if (bVar15) {
    Throw(local_100._M_dataplus._M_p,0x760);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>::~unique_ptr
            ((unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_> *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.error_._M_dataplus._M_p != &local_88.error_.field_2) {
    operator_delete(local_88.error_._M_dataplus._M_p,
                    CONCAT71(local_88.error_.field_2._M_allocated_capacity._1_7_,
                             local_88.error_.field_2._M_local_buf[0]) + 1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_a0);
  std::vector<PerThreadData,_std::allocator<PerThreadData>_>::~vector(&local_d8);
  return;
}

Assistant:

void Bloaty::ScanAndRollupFiles(const std::vector<std::string>& filenames,
                                std::vector<std::string>* build_ids,
                                Rollup* rollup) const {
  int num_cpus = std::thread::hardware_concurrency();
  int num_threads = std::min(num_cpus, static_cast<int>(filenames.size()));

  struct PerThreadData {
    Rollup rollup;
    std::vector<std::string> build_ids;
  };

  std::vector<PerThreadData> thread_data(num_threads);
  std::vector<std::thread> threads(num_threads);
  ThreadSafeIterIndex index(filenames.size());

  std::unique_ptr<ReImpl> regex = nullptr;
  if (options_.has_source_filter()) {
    regex = absl::make_unique<ReImpl>(options_.source_filter());
  }

  for (int i = 0; i < num_threads; i++) {
    thread_data[i].rollup.SetFilterRegex(regex.get());

    threads[i] = std::thread(
        [this, &index, &filenames](PerThreadData* data) {
          try {
            int j;
            while (index.TryGetNext(&j)) {
              ScanAndRollupFile(filenames[j], &data->rollup, &data->build_ids);
            }
          } catch (const bloaty::Error& e) {
            index.Abort(e.what());
          }
        },
        &thread_data[i]);
  }

  for (int i = 0; i < num_threads; i++) {
    threads[i].join();
    PerThreadData* data = &thread_data[i];
    if (i == 0) {
      *rollup = std::move(data->rollup);
    } else {
      rollup->Add(data->rollup);
    }

    build_ids->insert(build_ids->end(), data->build_ids.begin(),
                      data->build_ids.end());
  }

  std::string error;
  if (index.TryGetError(&error)) {
    THROW(error.c_str());
  }
}